

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O1

void __thiscall
QPointingDevicePrivate::sendTouchCancelEvent(QPointingDevicePrivate *this,QTouchEvent *cancelEvent)

{
  QEventPointPrivate *pQVar1;
  long lVar2;
  EventPointData *epd_1;
  QEventPoint *pQVar3;
  EventPointData *epd;
  
  if (((cancelEvent->super_QPointerEvent).m_points.d.size == 0) &&
     (lVar2 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
              super_QVLABaseBase.s, lVar2 != 0)) {
    pQVar3 = (QEventPoint *)
             (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
             super_QVLABaseBase.ptr;
    lVar2 = lVar2 * 0x58;
    do {
      pQVar1 = pQVar3[1].d.d.ptr;
      if (((pQVar1 != (QEventPointPrivate *)0x0) && (*(int *)&pQVar1->field_0x4 != 0)) &&
         (pQVar3[2].d.d.ptr != (QEventPointPrivate *)0x0)) {
        QMutableTouchEvent::addPoint(cancelEvent,pQVar3);
      }
      pQVar3 = pQVar3 + 0xb;
      lVar2 = lVar2 + -0x58;
    } while (lVar2 != 0);
  }
  lVar2 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
          super_QVLABaseBase.s;
  if (lVar2 != 0) {
    pQVar3 = (QEventPoint *)
             (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
             super_QVLABaseBase.ptr;
    lVar2 = lVar2 * 0x58;
    do {
      pQVar1 = pQVar3[1].d.d.ptr;
      if (((pQVar1 != (QEventPointPrivate *)0x0) && (*(int *)&pQVar1->field_0x4 != 0)) &&
         (pQVar3[2].d.d.ptr != (QEventPointPrivate *)0x0)) {
        if ((pQVar1 == (QEventPointPrivate *)0x0) || (*(int *)&pQVar1->field_0x4 == 0)) {
          pQVar1 = (QEventPointPrivate *)0x0;
        }
        else {
          pQVar1 = pQVar3[2].d.d.ptr;
        }
        QCoreApplication::sendEvent((QObject *)pQVar1,(QEvent *)cancelEvent);
      }
      QPointerEvent::setExclusiveGrabber(&cancelEvent->super_QPointerEvent,pQVar3,(QObject *)0x0);
      QPointerEvent::clearPassiveGrabbers(&cancelEvent->super_QPointerEvent,pQVar3);
      pQVar3 = pQVar3 + 0xb;
      lVar2 = lVar2 + -0x58;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void QPointingDevicePrivate::sendTouchCancelEvent(QTouchEvent *cancelEvent)
{
    // An incoming TouchCancel event will typically not contain any points, but
    // QQuickPointerHandler::onGrabChanged needs to be called for each point
    // that has an exclusive grabber. Adding those points to the event makes it
    // an easy iteration there.
    if (cancelEvent->points().isEmpty()) {
        for (auto &epd : activePoints.values()) {
            if (epd.exclusiveGrabber)
                QMutableTouchEvent::addPoint(cancelEvent, epd.eventPoint);
        }
    }
    for (auto &epd : activePoints.values()) {
        if (epd.exclusiveGrabber)
            QCoreApplication::sendEvent(epd.exclusiveGrabber, cancelEvent);
        // The next touch event can only be a TouchBegin, so clean up.
        cancelEvent->setExclusiveGrabber(epd.eventPoint, nullptr);
        cancelEvent->clearPassiveGrabbers(epd.eventPoint);
    }
}